

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_full_handshake_impl(int require_client_authentication)

{
  ptls_iovec_t pVar1;
  int require_client_authentication_local;
  
  sc_callcnt = 0;
  pVar1 = ptls_iovec_init((void *)0x0,0);
  test_handshake(pVar1,0,0,0,require_client_authentication);
  if (require_client_authentication == 0) {
    _ok((uint)(sc_callcnt == 1),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x346);
  }
  else {
    _ok((uint)(sc_callcnt == 2),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x344);
  }
  pVar1 = ptls_iovec_init((void *)0x0,0);
  test_handshake(pVar1,0,0,0,require_client_authentication);
  if (require_client_authentication == 0) {
    _ok((uint)(sc_callcnt == 2),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c");
  }
  else {
    _ok((uint)(sc_callcnt == 4),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c");
  }
  pVar1 = ptls_iovec_init((void *)0x0,0);
  test_handshake(pVar1,0,0,1,require_client_authentication);
  if (require_client_authentication == 0) {
    _ok((uint)(sc_callcnt == 3),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x354);
  }
  else {
    _ok((uint)(sc_callcnt == 6),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x352);
  }
  return;
}

Assistant:

static void test_full_handshake_impl(int require_client_authentication)
{
    sc_callcnt = 0;

    test_handshake(ptls_iovec_init(NULL, 0), TEST_HANDSHAKE_1RTT, 0, 0, require_client_authentication);
    if (require_client_authentication) {
        ok(sc_callcnt == 2);
    } else {
        ok(sc_callcnt == 1);
    }

    test_handshake(ptls_iovec_init(NULL, 0), TEST_HANDSHAKE_1RTT, 0, 0, require_client_authentication);
    if (require_client_authentication) {
        ok(sc_callcnt == 4);
    } else {
        ok(sc_callcnt == 2);
    }

    test_handshake(ptls_iovec_init(NULL, 0), TEST_HANDSHAKE_1RTT, 0, 1, require_client_authentication);
    if (require_client_authentication) {
        ok(sc_callcnt == 6);
    } else {
        ok(sc_callcnt == 3);
    }
}